

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3OsInit(void)

{
  int iVar1;
  void *p;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    p = sqlite3Malloc(10);
  }
  else {
    p = (void *)0x0;
  }
  if (p == (void *)0x0) {
    iVar1 = 7;
  }
  else {
    sqlite3_free(p);
    sqlite3_os_init();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsInit(void){
  void *p = sqlite3_malloc(10);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  sqlite3_free(p);
  return sqlite3_os_init();
}